

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::CuePoint::GetTime(CuePoint *this,Segment *pSegment)

{
  SegmentInfo *this_00;
  longlong lVar1;
  Segment *in_RSI;
  long in_RDI;
  longlong time;
  longlong scale;
  SegmentInfo *pInfo;
  
  this_00 = Segment::GetInfo(in_RSI);
  lVar1 = SegmentInfo::GetTimeCodeScale(this_00);
  return lVar1 * *(long *)(in_RDI + 0x18);
}

Assistant:

long long CuePoint::GetTime(const Segment* pSegment) const {
  assert(pSegment);
  assert(m_timecode >= 0);

  const SegmentInfo* const pInfo = pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long time = scale * m_timecode;

  return time;
}